

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_inttable_sizedinit(upb_inttable *t,uint32_t asize,int hsize_lg2,upb_Arena *a)

{
  int iVar1;
  upb_value *__s;
  ulong size;
  uint uVar2;
  ulong __n;
  ulong uVar3;
  
  iVar1 = init((EVP_PKEY_CTX *)t);
  if ((char)iVar1 != '\0') {
    uVar2 = asize + (asize == 0);
    uVar3 = (ulong)uVar2;
    t->array_size = uVar2;
    t->array_count = 0;
    __n = (ulong)(uVar2 + 7 >> 3);
    size = __n + uVar3 * 8 + 7 & 0xffffffff8;
    __s = (upb_value *)a->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)__s) < size) {
      __s = (upb_value *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
    }
    else {
      if ((upb_value *)((ulong)((long)&__s->val + 7U) & 0xfffffffffffffff8) != __s) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      a->ptr_dont_copy_me__upb_internal_use_only = (char *)((long)&__s->val + size);
    }
    if (__s != (upb_value *)0x0) {
      t->array = __s;
      memset(__s,0xff,uVar3 * 8);
      t->presence_mask = (uint8_t *)(__s + uVar3);
      memset(__s + uVar3,0,__n);
      return true;
    }
  }
  return false;
}

Assistant:

bool upb_inttable_sizedinit(upb_inttable* t, uint32_t asize, int hsize_lg2,
                            upb_Arena* a) {
  if (!init(&t->t, hsize_lg2, a)) return false;
  /* Always make the array part at least 1 long, so that we know key 0
   * won't be in the hash part, which simplifies things. */
  t->array_size = UPB_MAX(1, asize);
  t->array_count = 0;
#if UINT32_MAX >= SIZE_MAX
  if (UPB_UNLIKELY(SIZE_MAX / sizeof(upb_value) < t->array_size)) {
    return false;
  }
#endif

  // Allocate the array part and the presence mask array in one allocation.
  size_t array_bytes = t->array_size * sizeof(upb_value);
  uint32_t presence_bytes = presence_mask_arr_size(t->array_size);
  uintptr_t total_bytes = array_bytes + presence_bytes;
  if (UPB_UNLIKELY(total_bytes > SIZE_MAX)) {
    return false;
  }
  void* alloc = upb_Arena_Malloc(a, total_bytes);
  if (!alloc) {
    return false;
  }
  t->array = alloc;
  memset(mutable_array(t), 0xff, array_bytes);
  t->presence_mask = (uint8_t*)alloc + array_bytes;
  memset((uint8_t*)t->presence_mask, 0, presence_bytes);

  check(t);
  return true;
}